

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O3

Eci * __thiscall SGP4::FindPositionSDP4(Eci *__return_storage_ptr__,SGP4 *this,double tsince)

{
  SatelliteException *this_00;
  ulong uVar1;
  double dVar2;
  double dVar3;
  double local_c8;
  double local_c0;
  double xn;
  double local_b0;
  double xmdf;
  double em;
  double xmam;
  double local_90;
  double local_88;
  undefined8 uStack_80;
  double local_70;
  double xnode;
  double xinc;
  double omgadf;
  undefined8 uStack_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  local_b0 = (this->common_consts_).xmdot * tsince + (this->elements_).mean_anomoly_;
  xinc = (this->common_consts_).omgdot * tsince + (this->elements_).argument_perigee_;
  omgadf = tsince * tsince;
  local_70 = (this->common_consts_).xnodcf * omgadf +
             (this->common_consts_).xnodot * tsince + (this->elements_).ascending_node_;
  local_30 = (this->common_consts_).t2cof;
  local_88 = (this->common_consts_).c1;
  local_38 = (this->elements_).bstar_;
  local_48 = (this->common_consts_).c4;
  local_c0 = (this->elements_).recovered_mean_motion_;
  xmdf = (this->elements_).eccentricity_;
  xnode = (this->elements_).inclination_;
  local_40 = tsince;
  DeepSpaceSecular(tsince,&this->elements_,&this->common_consts_,&this->deepspace_consts_,
                   &this->integrator_params_,&local_b0,&xinc,&local_70,&xmdf,&xnode,&local_c0);
  if (local_c0 <= 0.0) {
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Error: (xn <= 0.0)");
  }
  else {
    omgadf = omgadf * local_30;
    local_38 = local_38 * local_48 * local_40;
    local_30 = pow(kXKE / local_c0,0.6666666666666666);
    local_c8 = xmdf - local_38;
    em = omgadf * (this->elements_).recovered_mean_motion_ + local_b0;
    DeepSpacePeriodics(local_40,&this->deepspace_consts_,&local_c8,&xnode,&xinc,&local_70,&em);
    if (-0.001 < local_c8) {
      local_38 = 1e-06;
      if ((1e-06 <= local_c8) && (local_38 = local_c8, 0.999999 < local_c8)) {
        local_38 = 0.999999;
      }
      dVar2 = -xnode;
      dVar3 = (double)(~-(ulong)(xnode < dVar2) & (ulong)xinc |
                      (ulong)(xinc + -3.141592653589793) & -(ulong)(xnode < dVar2));
      omgadf = xnode;
      local_48 = local_70;
      if (xnode < dVar2) {
        local_48 = local_70 + 3.141592653589793;
        omgadf = dVar2;
      }
      uStack_50 = 0x8000000000000000;
      xmam = em + dVar3 + local_48;
      dVar2 = 1.0 - local_88 * local_40;
      local_30 = local_30 * dVar2 * dVar2;
      uStack_80 = 0;
      local_88 = dVar3;
      local_90 = sin(omgadf);
      dVar3 = cos(omgadf);
      dVar2 = dVar3 * dVar3;
      uVar1 = -(ulong)(1.5e-12 < ABS(dVar3 + 1.0));
      xn = (double)((long)(local_40 * 60000000.0) + (this->elements_).epoch_.m_encoded);
      CalculateFinalPositionVelocity
                (__return_storage_ptr__,(DateTime *)&xn,local_38,local_30,local_88,xmam,local_48,
                 omgadf,((dVar3 * 5.0 + 3.0) * local_90 * 0.000586267430002882) /
                        (double)(~uVar1 & 0x3d7a636641c4df1a | (ulong)(dVar3 + 1.0) & uVar1),
                 local_90 * 0.001172534860005764,dVar2 * 3.0 + -1.0,1.0 - dVar2,dVar2 * 7.0 + -1.0,
                 dVar3,local_90);
      return __return_storage_ptr__;
    }
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Error: (e <= -0.001)");
  }
  __cxa_throw(this_00,&SatelliteException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Eci SGP4::FindPositionSDP4(double tsince) const
{
    /*
     * the final values
     */
    double e;
    double a;
    double omega;
    double xl;
    double xnode;
    double xinc;

    /*
     * update for secular gravity and atmospheric drag
     */
    double xmdf = elements_.MeanAnomoly()
        + common_consts_.xmdot * tsince;
    double omgadf = elements_.ArgumentPerigee()
        + common_consts_.omgdot * tsince;
    const double xnoddf = elements_.AscendingNode()
        + common_consts_.xnodot * tsince;

    const double tsq = tsince * tsince;
    xnode = xnoddf + common_consts_.xnodcf * tsq;
    double tempa = 1.0 - common_consts_.c1 * tsince;
    double tempe = elements_.BStar() * common_consts_.c4 * tsince;
    double templ = common_consts_.t2cof * tsq;

    double xn = elements_.RecoveredMeanMotion();
    double em = elements_.Eccentricity();
    xinc = elements_.Inclination();

    DeepSpaceSecular(tsince,
                     elements_,
                     common_consts_,
                     deepspace_consts_,
                     integrator_params_,
                     xmdf,
                     omgadf,
                     xnode,
                     em,
                     xinc,
                     xn);

    if (xn <= 0.0)
    {
        throw SatelliteException("Error: (xn <= 0.0)");
    }

    a = pow(kXKE / xn, kTWOTHIRD) * tempa * tempa;
    e = em - tempe;
    double xmam = xmdf + elements_.RecoveredMeanMotion() * templ;

    DeepSpacePeriodics(tsince,
                       deepspace_consts_,
                       e,
                       xinc,
                       omgadf,
                       xnode,
                       xmam);

    /*
     * keeping xinc positive important unless you need to display xinc
     * and dislike negative inclinations
     */
    if (xinc < 0.0)
    {
        xinc = -xinc;
        xnode += kPI;
        omgadf -= kPI;
    }

    xl = xmam + omgadf + xnode;
    omega = omgadf;

    /*
     * fix tolerance for error recognition
     */
    if (e <= -0.001)
    {
        throw SatelliteException("Error: (e <= -0.001)");
    }
    else if (e < 1.0e-6)
    {
        e = 1.0e-6;
    }
    else if (e > (1.0 - 1.0e-6))
    {
        e = 1.0 - 1.0e-6;
    }

    /*
     * re-compute the perturbed values
     */
    double perturbed_sinio;
    double perturbed_cosio;
    double perturbed_x3thm1;
    double perturbed_x1mth2;
    double perturbed_x7thm1;
    double perturbed_xlcof;
    double perturbed_aycof;
    RecomputeConstants(xinc,
                       perturbed_sinio,
                       perturbed_cosio,
                       perturbed_x3thm1,
                       perturbed_x1mth2,
                       perturbed_x7thm1,
                       perturbed_xlcof,
                       perturbed_aycof);

    /*
     * using calculated values, find position and velocity
     */
    return CalculateFinalPositionVelocity(elements_.Epoch().AddMinutes(tsince),
                                          e,
                                          a,
                                          omega,
                                          xl,
                                          xnode,
                                          xinc,
                                          perturbed_xlcof,
                                          perturbed_aycof,
                                          perturbed_x3thm1,
                                          perturbed_x1mth2,
                                          perturbed_x7thm1,
                                          perturbed_cosio,
                                          perturbed_sinio);
}